

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDeep.c
# Opt level: O3

Gia_Man_t * Gia_ManDeepSynOne(int nNoImpr,int TimeOut,int nAnds,int Seed,int fUseTwo,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Abc_Frame_t *pAVar3;
  Gia_Man_t *pGVar4;
  Gia_Man_t *p;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  timespec *format;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  timespec ts_2;
  timespec ts;
  long local_448;
  timespec local_438;
  uint local_424;
  int local_420;
  int local_41c;
  timespec local_418 [62];
  
  local_424 = TimeOut;
  local_420 = fVerbose;
  local_41c = fUseTwo;
  if (TimeOut == 0) {
    lVar6 = 0;
  }
  else {
    iVar1 = clock_gettime(3,local_418);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    lVar6 = (long)TimeOut * 1000000 + lVar6;
  }
  iVar1 = clock_gettime(3,local_418);
  if (iVar1 < 0) {
    local_448 = -1;
  }
  else {
    local_448 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  pAVar3 = Abc_FrameGetGlobalFrame();
  pGVar4 = Abc_FrameReadGia(pAVar3);
  pGVar4 = Gia_ManDup(pGVar4);
  Abc_Random(1);
  if (-10 < Seed) {
    iVar1 = Seed + 9;
    if (Seed + 9 < 1) {
      iVar1 = 0;
    }
    iVar1 = iVar1 + 1;
    do {
      Abc_Random(0);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  uVar9 = 0xffffffff;
  uVar12 = 0;
  do {
    uVar2 = Abc_Random(0);
    if (local_41c == 0) {
      uVar5 = (uVar12 & 3) + 3;
    }
    else {
      uVar5 = (uVar12 / 5) * -5 + 2 + uVar12;
    }
    pcVar11 = "; &put; compress2rs; &get";
    if ((uVar2 & 2) == 0) {
      pcVar11 = "; &dc2";
    }
    pcVar7 = " -f";
    if ((uVar2 & 1) == 0) {
      pcVar7 = "";
    }
    pcVar10 = "; &fx";
    if ((uVar2 & 4) == 0) {
      pcVar10 = "";
    }
    sprintf((char *)local_418,"&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",pcVar7,(ulong)uVar5,
            pcVar10,pcVar11);
    pAVar3 = Abc_FrameGetGlobalFrame();
    format = local_418;
    iVar1 = Cmd_CommandExecute(pAVar3,(char *)local_418);
    if (iVar1 != 0) {
      Abc_Print((int)pAVar3,(char *)format,local_418);
      return (Gia_Man_t *)0x0;
    }
    pAVar3 = Abc_FrameGetGlobalFrame();
    p = Abc_FrameReadGia(pAVar3);
    if ((pGVar4->vCis->nSize - pGVar4->nObjs) + pGVar4->vCos->nSize <
        (p->vCis->nSize - p->nObjs) + p->vCos->nSize) {
      Gia_ManStop(pGVar4);
      pGVar4 = Gia_ManDup(p);
      uVar9 = uVar12;
      if (local_420 != 0) {
        printf("Iter %6d : ",(ulong)uVar12);
        iVar1 = clock_gettime(3,&local_438);
        if (iVar1 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
        }
        printf("Time %8.2f sec : ",(double)((float)(lVar8 - local_448) / 1e+06));
        printf("And = %6d  ",
               (ulong)(uint)(~(pGVar4->vCos->nSize + pGVar4->vCis->nSize) + pGVar4->nObjs));
        uVar2 = Gia_ManLevelNum(pGVar4);
        printf("Lev = %3d  ",(ulong)uVar2);
        printf("<== best : ");
        printf("%s",local_418);
        putchar(10);
      }
    }
    if (lVar6 != 0) {
      iVar1 = clock_gettime(3,&local_438);
      if (iVar1 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
      }
      if (lVar6 < lVar8) {
        printf("Runtime limit (%d sec) is reached after %d iterations.\n",(ulong)local_424,
               (ulong)uVar12);
        goto LAB_0072dc9b;
      }
    }
    if (nNoImpr < (int)(uVar12 - uVar9)) {
      iVar1 = clock_gettime(3,&local_438);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
      }
      printf("Completed %d iterations without improvement in %.2f seconds.\n",
             (double)((float)(lVar6 - local_448) / 1e+06),(ulong)(uint)nNoImpr);
LAB_0072dc9b:
      if (nAnds < -1 || nAnds == 0) {
        return pGVar4;
      }
      iVar1 = clock_gettime(3,local_418);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      printf("Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n"
             ,(double)((float)(lVar6 - local_448) / 1e+06),0xffffffff,(ulong)(uint)nAnds,
             (ulong)uVar12);
      return pGVar4;
    }
    uVar12 = uVar12 + 1;
    if (uVar12 == 100000) {
      iVar1 = clock_gettime(3,local_418);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      printf("Iteration limit (%d iters) is reached after %.2f seconds.\n",
             (double)((float)(lVar6 - local_448) / 1e+06),100000);
      return pGVar4;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDeepSynOne( int nNoImpr, int TimeOut, int nAnds, int Seed, int fUseTwo, int fVerbose )
{
    abctime nTimeToStop = TimeOut ? Abc_Clock() + TimeOut * CLOCKS_PER_SEC : 0;
    abctime clkStart    = Abc_Clock();
    int s, i, IterMax   = 100000, nAndsMin = -1, iIterLast = -1;
    Gia_Man_t * pTemp   = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
    Gia_Man_t * pNew    = Gia_ManDup( pTemp );
    Abc_Random(1);
    for ( s = 0; s < 10+Seed; s++ )
        Abc_Random(0);
    for ( i = 0; i < IterMax; i++ )
    {
        unsigned Rand = Abc_Random(0);
        int fDch = Rand & 1;
        //int fCom = (Rand >> 1) & 3;
        int fCom = (Rand >> 1) & 1;
        int fFx  = (Rand >> 2) & 1;
        int KLut = fUseTwo ? 2 + (i % 5) : 3 + (i % 4);
        int fChange = 0;
        char Command[1000];
        char * pComp = NULL;
        if ( fCom == 3 )
            pComp = "; &put; compress2rs; compress2rs; compress2rs; &get";
        else if ( fCom == 2 )
            pComp = "; &put; compress2rs; compress2rs; &get";
        else if ( fCom == 1 )
            pComp = "; &put; compress2rs; &get";
        else if ( fCom == 0 )
            pComp = "; &dc2";
        sprintf( Command, "&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",
            fDch ? " -f" : "", KLut, fFx ? "; &fx" : "", pComp );
        if ( Cmd_CommandExecute(Abc_FrameGetGlobalFrame(), Command) )
        {
            Abc_Print( 1, "Something did not work out with the command \"%s\".\n", Command );
            return NULL;
        }
        pTemp = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
        if ( Gia_ManAndNum(pNew) > Gia_ManAndNum(pTemp) )
        {
            Gia_ManStop( pNew );
            pNew = Gia_ManDup( pTemp );
            fChange = 1;
            iIterLast = i;
        }
        else if ( Gia_ManAndNum(pNew) + Gia_ManAndNum(pNew)/10 < Gia_ManAndNum(pTemp) ) 
        {
            //printf( "Updating\n" );
            //Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), Gia_ManDup(pNew) );
        }
        if ( fChange && fVerbose )
        {
            printf( "Iter %6d : ", i );
            printf( "Time %8.2f sec : ", (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            printf( "And = %6d  ", Gia_ManAndNum(pNew) );
            printf( "Lev = %3d  ", Gia_ManLevelNum(pNew) );
            if ( fChange ) 
                printf( "<== best : " );
            else if ( fVerbose )
                printf( "           " );
            printf( "%s", Command );
            printf( "\n" );
        }
        if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        {
            printf( "Runtime limit (%d sec) is reached after %d iterations.\n", TimeOut, i );
            break;
        }
        if ( i - iIterLast > nNoImpr )
        {
            printf( "Completed %d iterations without improvement in %.2f seconds.\n", 
                nNoImpr, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            break;
        }
    }
    if ( i == IterMax )
        printf( "Iteration limit (%d iters) is reached after %.2f seconds.\n", IterMax, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    else if ( nAnds && nAndsMin <= nAnds )
        printf( "Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n", 
            nAndsMin, nAnds, i, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    return pNew;
}